

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemTxResult
memory_region_dispatch_read_mips64
          (uc_struct_conflict6 *uc,MemoryRegion *mr,hwaddr addr,uint64_t *pval,MemOp_conflict1 op,
          MemTxAttrs attrs)

{
  MemoryRegionOps *pMVar1;
  _Bool _Var2;
  MemTxResult MVar3;
  uint size;
  code *access_fn;
  
  size = 1 << ((byte)op & 3);
  _Var2 = memory_region_access_valid_mips64(uc,mr,addr,size,false,attrs);
  *pval = 0;
  if (_Var2) {
    pMVar1 = mr->ops;
    access_fn = memory_region_read_accessor;
    if (pMVar1->read == (_func_uint64_t_uc_struct_ptr_void_ptr_hwaddr_uint_conflict15 *)0x0) {
      access_fn = memory_region_read_with_attrs_accessor;
    }
    MVar3 = access_with_adjusted_size
                      (uc,addr,pval,size,(pMVar1->impl).min_access_size,
                       (pMVar1->impl).max_access_size,access_fn,mr,attrs);
    adjust_endianness(mr,pval,op);
  }
  else {
    MVar3 = 2;
  }
  return MVar3;
}

Assistant:

MemTxResult memory_region_dispatch_read(struct uc_struct *uc, MemoryRegion *mr,
                                        hwaddr addr,
                                        uint64_t *pval,
                                        MemOp op,
                                        MemTxAttrs attrs)
{
    unsigned size = memop_size(op);
    MemTxResult r;

    if (!memory_region_access_valid(uc, mr, addr, size, false, attrs)) {
        *pval = unassigned_mem_read(mr, addr, size);
        return MEMTX_DECODE_ERROR;
    }

    r = memory_region_dispatch_read1(uc, mr, addr, pval, size, attrs);
    adjust_endianness(mr, pval, op);
    return r;
}